

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O0

void createSimpleNeuralNetworkClassifierModel(Model *spec,char *inputName,char *outputName)

{
  char *pcVar1;
  ModelDescription *pMVar2;
  FeatureDescription *pFVar3;
  Arena *pAVar4;
  FeatureType *pFVar5;
  ArrayFeatureType *pAVar6;
  TypeUnion this;
  ArenaStringPtr *pAVar7;
  DictionaryFeatureType *this_00;
  NeuralNetworkClassifier *this_01;
  StringVector *this_02;
  NeuralNetworkLayer *pNVar8;
  InnerProductLayerParams *pIVar9;
  WeightParams *pWVar10;
  int local_14c;
  int i_1;
  InnerProductLayerParams *innerProductParams2;
  NeuralNetworkLayer *innerProductLayer2;
  int i;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  StringVector *labels;
  NeuralNetworkClassifier *nn;
  string local_108 [8];
  string probsName;
  allocator<char> local_d1;
  string local_d0 [8];
  string featureName;
  FeatureDescription *out3;
  FeatureDescription *out2;
  ArrayFeatureType *outshape;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  char *outputName_local;
  char *inputName_local;
  Model *spec_local;
  TypeUnion local_60;
  char **local_58;
  FeatureDescription *local_50;
  char *local_48;
  FeatureDescription *local_40;
  char *local_38;
  FeatureDescription *local_30;
  string *local_28;
  ModelDescription *local_20;
  string *local_18;
  ModelDescription *local_10;
  
  topIn = (FeatureDescription *)outputName;
  outputName_local = inputName;
  inputName_local = (char *)spec;
  CoreML::Specification::Model::set_specificationversion(spec,9);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)inputName_local);
  pFVar3 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  pcVar1 = outputName_local;
  local_58 = &outputName_local;
  local_50 = pFVar3;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,pcVar1,pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype(pAVar6,ArrayFeatureType_ArrayDataType_INT32)
  ;
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)inputName_local);
  this.pipelineclassifier_ =
       (PipelineClassifier *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  pFVar3 = topIn;
  spec_local = (Model *)&topIn;
  local_60.pipelineclassifier_ = this.pipelineclassifier_;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)this.pipelineclassifier_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)&(this.pipelineclassifier_)->pipeline_,pFVar3,pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)this.pipelineclassifier_);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::add_shape(pAVar6,3);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)this.pipelineclassifier_);
  pAVar6 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar5);
  CoreML::Specification::ArrayFeatureType::set_datatype(pAVar6,ArrayFeatureType_ArrayDataType_INT32)
  ;
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)inputName_local);
  pFVar3 = CoreML::Specification::ModelDescription::add_output(pMVar2);
  local_48 = "features";
  local_40 = pFVar3;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar3->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar3->name_,"features",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type(pFVar3);
  CoreML::Specification::FeatureType::mutable_stringtype(pFVar5);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)inputName_local);
  featureName.field_2._8_8_ = CoreML::Specification::ModelDescription::add_output(pMVar2);
  local_38 = "probs";
  pAVar7 = &((FeatureDescription *)featureName.field_2._8_8_)->name_;
  local_30 = (FeatureDescription *)featureName.field_2._8_8_;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)featureName.field_2._8_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar7,"probs",pAVar4);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)featureName.field_2._8_8_);
  CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar5);
  pFVar5 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)featureName.field_2._8_8_);
  this_00 = CoreML::Specification::FeatureType::mutable_dictionarytype(pFVar5);
  CoreML::Specification::DictionaryFeatureType::mutable_stringkeytype(this_00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"features",&local_d1);
  std::allocator<char>::~allocator(&local_d1);
  local_20 = CoreML::Specification::Model::mutable_description((Model *)inputName_local);
  pAVar7 = &local_20->predictedfeaturename_;
  local_28 = local_d0;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&local_20->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(pAVar7,local_d0,pAVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_108,"probs",(allocator<char> *)((long)&nn + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&nn + 7));
  local_10 = CoreML::Specification::Model::mutable_description((Model *)inputName_local);
  pAVar7 = &local_10->predictedprobabilitiesname_;
  local_18 = local_108;
  pAVar4 = google::protobuf::MessageLite::GetArenaForAllocation(&local_10->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::Set(pAVar7,local_108,pAVar4);
  this_01 = CoreML::Specification::Model::mutable_neuralnetworkclassifier((Model *)inputName_local);
  this_02 = CoreML::Specification::NeuralNetworkClassifier::mutable_stringclasslabels(this_01);
  CoreML::Specification::StringVector::add_vector(this_02,"label1");
  pNVar8 = CoreML::Specification::NeuralNetworkClassifier::add_layers(this_01);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar8,outputName_local);
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar8,"middle");
  pIVar9 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar8);
  CoreML::Specification::InnerProductLayerParams::set_hasbias(pIVar9,false);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(pIVar9,3);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(pIVar9,3);
  for (innerProductLayer2._4_4_ = 0; innerProductLayer2._4_4_ < 9;
      innerProductLayer2._4_4_ = innerProductLayer2._4_4_ + 1) {
    pWVar10 = CoreML::Specification::InnerProductLayerParams::mutable_weights(pIVar9);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar10,1.0);
  }
  pNVar8 = CoreML::Specification::NeuralNetworkClassifier::add_layers(this_01);
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar8,"middle");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar8,(char *)topIn);
  pIVar9 = CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct(pNVar8);
  CoreML::Specification::InnerProductLayerParams::set_hasbias(pIVar9,false);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels(pIVar9,3);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels(pIVar9,3);
  for (local_14c = 0; local_14c < 9; local_14c = local_14c + 1) {
    pWVar10 = CoreML::Specification::InnerProductLayerParams::mutable_weights(pIVar9);
    CoreML::Specification::WeightParams::add_floatvalue(pWVar10,1.0);
  }
  std::__cxx11::string::~string(local_108);
  std::__cxx11::string::~string(local_d0);
  return;
}

Assistant:

void createSimpleNeuralNetworkClassifierModel(Specification::Model *spec, const char *inputName, const char *outputName) {
    
    spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);

    auto *topIn = spec->mutable_description()->add_input();
    topIn->set_name(inputName);
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(3);
    topIn->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out = spec->mutable_description()->add_output();
    out->set_name(outputName);
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(3);
    out->mutable_type()->mutable_multiarraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_INT32);

    auto *out2 = spec->mutable_description()->add_output();
    out2->set_name("features");
    out2->mutable_type()->mutable_stringtype();

    auto *out3 = spec->mutable_description()->add_output();
    out3->set_name("probs");
    out3->mutable_type()->mutable_dictionarytype();
    out3->mutable_type()->mutable_dictionarytype()->mutable_stringkeytype();

    std::string featureName = "features";
    spec->mutable_description()->set_predictedfeaturename(featureName);
    std::string probsName = "probs";
    spec->mutable_description()->set_predictedprobabilitiesname(probsName);

    const auto nn = spec->mutable_neuralnetworkclassifier();
    auto labels = nn->mutable_stringclasslabels();
    labels->add_vector("label1");

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();
    innerProductLayer->add_input(inputName);
    innerProductLayer->add_output("middle");
    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_hasbias(false);
    innerProductParams->set_inputchannels(3);
    innerProductParams->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams->mutable_weights()->add_floatvalue(1.0);
    }

    Specification::NeuralNetworkLayer *innerProductLayer2 = nn->add_layers();
    innerProductLayer2->add_input("middle");
    innerProductLayer2->add_output(outputName);
    Specification::InnerProductLayerParams *innerProductParams2 = innerProductLayer2->mutable_innerproduct();
    innerProductParams2->set_hasbias(false);
    innerProductParams2->set_inputchannels(3);
    innerProductParams2->set_outputchannels(3);
    for (int i = 0; i < 9; i++) {
        innerProductParams2->mutable_weights()->add_floatvalue(1.0);
    }
}